

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O0

uint deflateDynamic(LodePNGBitWriter *writer,Hash *hash,uchar *data,size_t datapos,size_t dataend,
                   LodePNGCompressSettings *settings,uint final)

{
  uint uVar1;
  uint uVar2;
  Hash *hash_00;
  uchar *in;
  void *dst;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  void *pvVar6;
  void *pvVar7;
  ulong in_RCX;
  long in_RDX;
  long lVar8;
  ulong in_R8;
  long in_R9;
  bool bVar9;
  uint rest;
  uint num;
  size_t k;
  uint j;
  uint dist;
  uint symbol;
  uint HCLEN;
  uint HDIST;
  uint HLIT;
  size_t numcodes_cl;
  size_t numcodes_lld_e;
  size_t numcodes_lld;
  size_t numcodes_d;
  size_t numcodes_ll;
  size_t i;
  uint BFINAL;
  size_t datasize;
  uint *bitlen_lld_e;
  uint *bitlen_lld;
  uint *frequencies_cl;
  uint *frequencies_d;
  uint *frequencies_ll;
  HuffmanTree tree_cl;
  HuffmanTree tree_d;
  HuffmanTree tree_ll;
  uivector lz77_encoded;
  uint error;
  uint in_stack_fffffffffffffe7c;
  undefined4 in_stack_fffffffffffffe80;
  undefined4 in_stack_fffffffffffffe84;
  undefined4 in_stack_fffffffffffffe88;
  uint in_stack_fffffffffffffe8c;
  LodePNGBitWriter *in_stack_fffffffffffffe90;
  undefined6 in_stack_fffffffffffffe98;
  undefined1 in_stack_fffffffffffffe9e;
  undefined1 uVar10;
  undefined1 in_stack_fffffffffffffe9f;
  uint in_stack_fffffffffffffea8;
  uint in_stack_fffffffffffffeac;
  LodePNGBitWriter *in_stack_fffffffffffffeb0;
  uint local_148;
  ulong local_130;
  long local_128;
  size_t local_108;
  size_t insize;
  uivector *in_stack_ffffffffffffff38;
  uint *local_c0;
  uint in_stack_ffffffffffffff50;
  uint in_stack_ffffffffffffff58;
  uint in_stack_ffffffffffffff60;
  uint *local_98;
  uint local_8c;
  HuffmanTree local_78;
  uivector local_50;
  uint local_34;
  long local_30;
  ulong local_28;
  ulong local_20;
  long local_18;
  
  local_34 = 0;
  insize = 0;
  uVar1 = 0;
  local_30 = in_R9;
  local_28 = in_R8;
  local_20 = in_RCX;
  local_18 = in_RDX;
  uivector_init(&local_50);
  HuffmanTree_init(&local_78);
  HuffmanTree_init((HuffmanTree *)&stack0xffffffffffffff60);
  HuffmanTree_init((HuffmanTree *)&stack0xffffffffffffff38);
  hash_00 = (Hash *)lodepng_malloc(0x16fbf9);
  in = (uchar *)lodepng_malloc(0x16fc0b);
  dst = lodepng_malloc(0x16fc1d);
  if (((hash_00 == (Hash *)0x0) || (in == (uchar *)0x0)) || (dst == (void *)0x0)) {
    local_34 = 0x53;
  }
  if (local_34 == 0) {
    lodepng_memset(hash_00,0,0x478);
    lodepng_memset(in,0,0x78);
    lodepng_memset(dst,0,0x4c);
    if (*(int *)(local_30 + 4) == 0) {
      uVar1 = uivector_resize((uivector *)
                              CONCAT17(in_stack_fffffffffffffe9f,
                                       CONCAT16(in_stack_fffffffffffffe9e,in_stack_fffffffffffffe98)
                                      ),(size_t)in_stack_fffffffffffffe90);
      if (uVar1 == 0) {
        local_34 = 0x53;
        goto LAB_00170784;
      }
      for (local_108 = local_20; local_108 < local_28; local_108 = local_108 + 1) {
        local_50.data[local_108 - local_20] = (uint)*(byte *)(local_18 + local_108);
      }
    }
    else {
      in_stack_fffffffffffffe80 = *(undefined4 *)(local_30 + 0x10);
      in_stack_fffffffffffffe88 = *(undefined4 *)(local_30 + 0x14);
      local_34 = encodeLZ77(in_stack_ffffffffffffff38,hash_00,in,(size_t)dst,insize,uVar1,
                            in_stack_ffffffffffffff50,in_stack_ffffffffffffff58,
                            in_stack_ffffffffffffff60);
      if (local_34 != 0) goto LAB_00170784;
      local_34 = 0;
    }
    for (local_108 = 0; local_108 != local_50.size; local_108 = local_108 + 1) {
      uVar1 = local_50.data[local_108];
      *(int *)((long)&hash_00->head + (ulong)uVar1 * 4) =
           *(int *)((long)&hash_00->head + (ulong)uVar1 * 4) + 1;
      if (0x100 < uVar1) {
        *(int *)(in + (ulong)local_50.data[local_108 + 2] * 4) =
             *(int *)(in + (ulong)local_50.data[local_108 + 2] * 4) + 1;
        local_108 = local_108 + 3;
      }
    }
    *(undefined4 *)&hash_00[0x15].val = 1;
    local_34 = HuffmanTree_makeFromFrequencies
                         ((HuffmanTree *)
                          CONCAT17(in_stack_fffffffffffffe9f,
                                   CONCAT16(in_stack_fffffffffffffe9e,in_stack_fffffffffffffe98)),
                          (uint *)in_stack_fffffffffffffe90,
                          CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88),
                          CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80),
                          in_stack_fffffffffffffe7c);
    if ((local_34 == 0) &&
       (local_34 = HuffmanTree_makeFromFrequencies
                             ((HuffmanTree *)
                              CONCAT17(in_stack_fffffffffffffe9f,
                                       CONCAT16(in_stack_fffffffffffffe9e,in_stack_fffffffffffffe98)
                                      ),(uint *)in_stack_fffffffffffffe90,
                              CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88),
                              CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80),
                              in_stack_fffffffffffffe7c), local_34 == 0)) {
      uVar1 = local_78.numcodes;
      if (0x11d < local_78.numcodes) {
        uVar1 = 0x11e;
      }
      uVar3 = (ulong)uVar1;
      if (0x1d < local_8c) {
        local_8c = 0x1e;
      }
      uVar4 = (ulong)local_8c;
      uVar5 = uVar3 + uVar4;
      pvVar6 = lodepng_malloc(0x16ff84);
      pvVar7 = lodepng_malloc(0x16ff9a);
      if ((pvVar6 == (void *)0x0) || (pvVar7 == (void *)0x0)) {
        local_34 = 0x53;
      }
      else {
        local_128 = 0;
        for (local_108 = 0; local_108 != uVar3; local_108 = local_108 + 1) {
          *(uint *)((long)pvVar6 + local_108 * 4) = local_78.lengths[local_108];
        }
        for (local_108 = 0; local_108 != uVar4; local_108 = local_108 + 1) {
          *(uint *)((long)pvVar6 + (uVar3 + local_108) * 4) = local_98[local_108];
        }
        for (local_108 = 0; local_108 != uVar5; local_108 = local_108 + 1) {
          local_148 = 0;
          while( true ) {
            bVar9 = false;
            if (local_108 + local_148 + 1 < uVar5) {
              bVar9 = *(int *)((long)pvVar6 + (local_108 + local_148) * 4 + 4) ==
                      *(int *)((long)pvVar6 + local_108 * 4);
            }
            if (!bVar9) break;
            local_148 = local_148 + 1;
          }
          if ((*(int *)((long)pvVar6 + local_108 * 4) == 0) && (1 < local_148)) {
            uVar2 = local_148 + 1;
            if (uVar2 < 0xb) {
              *(undefined4 *)((long)pvVar7 + local_128 * 4) = 0x11;
              *(uint *)((long)pvVar7 + (local_128 + 1) * 4) = local_148 - 2;
              local_148 = uVar2;
            }
            else {
              local_148 = uVar2;
              if (0x8a < uVar2) {
                local_148 = 0x8a;
              }
              *(undefined4 *)((long)pvVar7 + local_128 * 4) = 0x12;
              *(uint *)((long)pvVar7 + (local_128 + 1) * 4) = local_148 - 0xb;
            }
            local_128 = local_128 + 2;
            local_108 = (local_148 - 1) + local_108;
          }
          else if (local_148 < 3) {
            *(undefined4 *)((long)pvVar7 + local_128 * 4) =
                 *(undefined4 *)((long)pvVar6 + local_108 * 4);
            local_128 = local_128 + 1;
          }
          else {
            in_stack_fffffffffffffeac = local_148 / 6;
            in_stack_fffffffffffffea8 = local_148 % 6;
            *(undefined4 *)((long)pvVar7 + local_128 * 4) =
                 *(undefined4 *)((long)pvVar6 + local_108 * 4);
            local_128 = local_128 + 1;
            for (in_stack_fffffffffffffeb0 = (LodePNGBitWriter *)0x0;
                in_stack_fffffffffffffeb0 < (LodePNGBitWriter *)(ulong)in_stack_fffffffffffffeac;
                in_stack_fffffffffffffeb0 =
                     (LodePNGBitWriter *)((long)&in_stack_fffffffffffffeb0->data + 1)) {
              lVar8 = local_128 + 1;
              *(undefined4 *)((long)pvVar7 + local_128 * 4) = 0x10;
              local_128 = local_128 + 2;
              *(undefined4 *)((long)pvVar7 + lVar8 * 4) = 3;
            }
            if (in_stack_fffffffffffffea8 < 3) {
              local_148 = local_148 - in_stack_fffffffffffffea8;
            }
            else {
              lVar8 = local_128 + 1;
              *(undefined4 *)((long)pvVar7 + local_128 * 4) = 0x10;
              local_128 = local_128 + 2;
              *(uint *)((long)pvVar7 + lVar8 * 4) = in_stack_fffffffffffffea8 - 3;
            }
            local_108 = local_148 + local_108;
          }
          in_stack_fffffffffffffe9f = 0;
        }
        for (local_108 = 0; local_108 != local_128; local_108 = local_108 + 1) {
          uVar3 = (ulong)*(uint *)((long)pvVar7 + local_108 * 4);
          *(int *)((long)dst + uVar3 * 4) = *(int *)((long)dst + uVar3 * 4) + 1;
          if (0xf < *(uint *)((long)pvVar7 + local_108 * 4)) {
            local_108 = local_108 + 1;
          }
        }
        local_34 = HuffmanTree_makeFromFrequencies
                             ((HuffmanTree *)
                              CONCAT17(in_stack_fffffffffffffe9f,
                                       CONCAT16(in_stack_fffffffffffffe9e,in_stack_fffffffffffffe98)
                                      ),(uint *)in_stack_fffffffffffffe90,
                              CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88),
                              CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80),
                              in_stack_fffffffffffffe7c);
        if (local_34 == 0) {
          local_130 = 0x13;
          while( true ) {
            uVar10 = false;
            if (4 < local_130) {
              uVar10 = local_c0[CLCL_ORDER[local_130 - 1]] == 0;
            }
            if ((bool)uVar10 == false) break;
            local_130 = local_130 - 1;
          }
          writeBits(in_stack_fffffffffffffe90,in_stack_fffffffffffffe8c,
                    CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80));
          writeBits(in_stack_fffffffffffffe90,in_stack_fffffffffffffe8c,
                    CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80));
          writeBits(in_stack_fffffffffffffe90,in_stack_fffffffffffffe8c,
                    CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80));
          writeBits(in_stack_fffffffffffffe90,in_stack_fffffffffffffe8c,
                    CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80));
          writeBits(in_stack_fffffffffffffe90,in_stack_fffffffffffffe8c,
                    CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80));
          writeBits(in_stack_fffffffffffffe90,in_stack_fffffffffffffe8c,
                    CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80));
          for (local_108 = 0; local_108 != local_130; local_108 = local_108 + 1) {
            writeBits(in_stack_fffffffffffffe90,in_stack_fffffffffffffe8c,
                      CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80));
          }
          for (local_108 = 0; local_108 != local_128; local_108 = local_108 + 1) {
            writeBitsReversed(in_stack_fffffffffffffe90,in_stack_fffffffffffffe8c,
                              CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80));
            if (*(int *)((long)pvVar7 + local_108 * 4) == 0x10) {
              local_108 = local_108 + 1;
              writeBits(in_stack_fffffffffffffe90,in_stack_fffffffffffffe8c,
                        CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80));
            }
            else if (*(int *)((long)pvVar7 + local_108 * 4) == 0x11) {
              local_108 = local_108 + 1;
              writeBits(in_stack_fffffffffffffe90,in_stack_fffffffffffffe8c,
                        CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80));
            }
            else if (*(int *)((long)pvVar7 + local_108 * 4) == 0x12) {
              local_108 = local_108 + 1;
              writeBits(in_stack_fffffffffffffe90,in_stack_fffffffffffffe8c,
                        CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80));
            }
          }
          writeLZ77data(in_stack_fffffffffffffeb0,
                        (uivector *)CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8),
                        (HuffmanTree *)CONCAT44(uVar1,local_8c),
                        (HuffmanTree *)
                        CONCAT17(in_stack_fffffffffffffe9f,
                                 CONCAT16(uVar10,in_stack_fffffffffffffe98)));
          if (local_78.lengths[0x100] == 0) {
            local_34 = 0x40;
          }
          else {
            writeBitsReversed(in_stack_fffffffffffffe90,in_stack_fffffffffffffe8c,
                              CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80));
          }
        }
      }
    }
  }
LAB_00170784:
  uivector_cleanup((void *)0x170791);
  HuffmanTree_cleanup((HuffmanTree *)0x17079e);
  HuffmanTree_cleanup((HuffmanTree *)0x1707ab);
  HuffmanTree_cleanup((HuffmanTree *)0x1707b8);
  lodepng_free((void *)0x1707c5);
  lodepng_free((void *)0x1707d2);
  lodepng_free((void *)0x1707df);
  lodepng_free((void *)0x1707ec);
  lodepng_free((void *)0x1707f9);
  return local_34;
}

Assistant:

static unsigned deflateDynamic(LodePNGBitWriter* writer, Hash* hash,
  const unsigned char* data, size_t datapos, size_t dataend,
  const LodePNGCompressSettings* settings, unsigned final) {
  unsigned error = 0;

  /*
  A block is compressed as follows: The PNG data is lz77 encoded, resulting in
  literal bytes and length/distance pairs. This is then huffman compressed with
  two huffman trees. One huffman tree is used for the lit and len values ("ll"),
  another huffman tree is used for the dist values ("d"). These two trees are
  stored using their code lengths, and to compress even more these code lengths
  are also run-length encoded and huffman compressed. This gives a huffman tree
  of code lengths "cl". The code lengths used to describe this third tree are
  the code length code lengths ("clcl").
  */

  /*The lz77 encoded data, represented with integers since there will also be length and distance codes in it*/
  uivector lz77_encoded;
  HuffmanTree tree_ll; /*tree for lit,len values*/
  HuffmanTree tree_d; /*tree for distance codes*/
  HuffmanTree tree_cl; /*tree for encoding the code lengths representing tree_ll and tree_d*/
  unsigned* frequencies_ll = 0; /*frequency of lit,len codes*/
  unsigned* frequencies_d = 0; /*frequency of dist codes*/
  unsigned* frequencies_cl = 0; /*frequency of code length codes*/
  unsigned* bitlen_lld = 0; /*lit,len,dist code lengths (int bits), literally (without repeat codes).*/
  unsigned* bitlen_lld_e = 0; /*bitlen_lld encoded with repeat codes (this is a rudimentary run length compression)*/
  size_t datasize = dataend - datapos;

  /*
  If we could call "bitlen_cl" the the code length code lengths ("clcl"), that is the bit lengths of codes to represent
  tree_cl in CLCL_ORDER, then due to the huffman compression of huffman tree representations ("two levels"), there are
  some analogies:
  bitlen_lld is to tree_cl what data is to tree_ll and tree_d.
  bitlen_lld_e is to bitlen_lld what lz77_encoded is to data.
  bitlen_cl is to bitlen_lld_e what bitlen_lld is to lz77_encoded.
  */

  unsigned BFINAL = final;
  size_t i;
  size_t numcodes_ll, numcodes_d, numcodes_lld, numcodes_lld_e, numcodes_cl;
  unsigned HLIT, HDIST, HCLEN;

  uivector_init(&lz77_encoded);
  HuffmanTree_init(&tree_ll);
  HuffmanTree_init(&tree_d);
  HuffmanTree_init(&tree_cl);
  /* could fit on stack, but >1KB is on the larger side so allocate instead */
  frequencies_ll = (unsigned*)lodepng_malloc(286 * sizeof(*frequencies_ll));
  frequencies_d = (unsigned*)lodepng_malloc(30 * sizeof(*frequencies_d));
  frequencies_cl = (unsigned*)lodepng_malloc(NUM_CODE_LENGTH_CODES * sizeof(*frequencies_cl));

  if (!frequencies_ll || !frequencies_d || !frequencies_cl) error = 83; /*alloc fail*/

  /*This while loop never loops due to a break at the end, it is here to
  allow breaking out of it to the cleanup phase on error conditions.*/
  while (!error) {
    lodepng_memset(frequencies_ll, 0, 286 * sizeof(*frequencies_ll));
    lodepng_memset(frequencies_d, 0, 30 * sizeof(*frequencies_d));
    lodepng_memset(frequencies_cl, 0, NUM_CODE_LENGTH_CODES * sizeof(*frequencies_cl));

    if (settings->use_lz77) {
      error = encodeLZ77(&lz77_encoded, hash, data, datapos, dataend, settings->windowsize,
        settings->minmatch, settings->nicematch, settings->lazymatching);
      if (error) break;
    }
    else {
      if (!uivector_resize(&lz77_encoded, datasize)) ERROR_BREAK(83 /*alloc fail*/);
      for (i = datapos; i < dataend; ++i) lz77_encoded.data[i - datapos] = data[i]; /*no LZ77, but still will be Huffman compressed*/
    }

    /*Count the frequencies of lit, len and dist codes*/
    for (i = 0; i != lz77_encoded.size; ++i) {
      unsigned symbol = lz77_encoded.data[i];
      ++frequencies_ll[symbol];
      if (symbol > 256) {
        unsigned dist = lz77_encoded.data[i + 2];
        ++frequencies_d[dist];
        i += 3;
      }
    }
    frequencies_ll[256] = 1; /*there will be exactly 1 end code, at the end of the block*/

    /*Make both huffman trees, one for the lit and len codes, one for the dist codes*/
    error = HuffmanTree_makeFromFrequencies(&tree_ll, frequencies_ll, 257, 286, 15);
    if (error) break;
    /*2, not 1, is chosen for mincodes: some buggy PNG decoders require at least 2 symbols in the dist tree*/
    error = HuffmanTree_makeFromFrequencies(&tree_d, frequencies_d, 2, 30, 15);
    if (error) break;

    numcodes_ll = LODEPNG_MIN(tree_ll.numcodes, 286);
    numcodes_d = LODEPNG_MIN(tree_d.numcodes, 30);
    /*store the code lengths of both generated trees in bitlen_lld*/
    numcodes_lld = numcodes_ll + numcodes_d;
    bitlen_lld = (unsigned*)lodepng_malloc(numcodes_lld * sizeof(*bitlen_lld));
    /*numcodes_lld_e never needs more size than bitlen_lld*/
    bitlen_lld_e = (unsigned*)lodepng_malloc(numcodes_lld * sizeof(*bitlen_lld_e));
    if (!bitlen_lld || !bitlen_lld_e) ERROR_BREAK(83); /*alloc fail*/
    numcodes_lld_e = 0;

    for (i = 0; i != numcodes_ll; ++i) bitlen_lld[i] = tree_ll.lengths[i];
    for (i = 0; i != numcodes_d; ++i) bitlen_lld[numcodes_ll + i] = tree_d.lengths[i];

    /*run-length compress bitlen_ldd into bitlen_lld_e by using repeat codes 16 (copy length 3-6 times),
    17 (3-10 zeroes), 18 (11-138 zeroes)*/
    for (i = 0; i != numcodes_lld; ++i) {
      unsigned j = 0; /*amount of repetitions*/
      while (i + j + 1 < numcodes_lld && bitlen_lld[i + j + 1] == bitlen_lld[i]) ++j;

      if (bitlen_lld[i] == 0 && j >= 2) /*repeat code for zeroes*/ {
        ++j; /*include the first zero*/
        if (j <= 10) /*repeat code 17 supports max 10 zeroes*/ {
          bitlen_lld_e[numcodes_lld_e++] = 17;
          bitlen_lld_e[numcodes_lld_e++] = j - 3;
        }
        else /*repeat code 18 supports max 138 zeroes*/ {
          if (j > 138) j = 138;
          bitlen_lld_e[numcodes_lld_e++] = 18;
          bitlen_lld_e[numcodes_lld_e++] = j - 11;
        }
        i += (j - 1);
      }
      else if (j >= 3) /*repeat code for value other than zero*/ {
        size_t k;
        unsigned num = j / 6u, rest = j % 6u;
        bitlen_lld_e[numcodes_lld_e++] = bitlen_lld[i];
        for (k = 0; k < num; ++k) {
          bitlen_lld_e[numcodes_lld_e++] = 16;
          bitlen_lld_e[numcodes_lld_e++] = 6 - 3;
        }
        if (rest >= 3) {
          bitlen_lld_e[numcodes_lld_e++] = 16;
          bitlen_lld_e[numcodes_lld_e++] = rest - 3;
        }
        else j -= rest;
        i += j;
      }
      else /*too short to benefit from repeat code*/ {
        bitlen_lld_e[numcodes_lld_e++] = bitlen_lld[i];
      }
    }

    /*generate tree_cl, the huffmantree of huffmantrees*/
    for (i = 0; i != numcodes_lld_e; ++i) {
      ++frequencies_cl[bitlen_lld_e[i]];
      /*after a repeat code come the bits that specify the number of repetitions,
      those don't need to be in the frequencies_cl calculation*/
      if (bitlen_lld_e[i] >= 16) ++i;
    }

    error = HuffmanTree_makeFromFrequencies(&tree_cl, frequencies_cl,
      NUM_CODE_LENGTH_CODES, NUM_CODE_LENGTH_CODES, 7);
    if (error) break;

    /*compute amount of code-length-code-lengths to output*/
    numcodes_cl = NUM_CODE_LENGTH_CODES;
    /*trim zeros at the end (using CLCL_ORDER), but minimum size must be 4 (see HCLEN below)*/
    while (numcodes_cl > 4u && tree_cl.lengths[CLCL_ORDER[numcodes_cl - 1u]] == 0) {
      numcodes_cl--;
    }

    /*
    Write everything into the output

    After the BFINAL and BTYPE, the dynamic block consists out of the following:
    - 5 bits HLIT, 5 bits HDIST, 4 bits HCLEN
    - (HCLEN+4)*3 bits code lengths of code length alphabet
    - HLIT + 257 code lengths of lit/length alphabet (encoded using the code length
      alphabet, + possible repetition codes 16, 17, 18)
    - HDIST + 1 code lengths of distance alphabet (encoded using the code length
      alphabet, + possible repetition codes 16, 17, 18)
    - compressed data
    - 256 (end code)
    */

    /*Write block type*/
    writeBits(writer, BFINAL, 1);
    writeBits(writer, 0, 1); /*first bit of BTYPE "dynamic"*/
    writeBits(writer, 1, 1); /*second bit of BTYPE "dynamic"*/

    /*write the HLIT, HDIST and HCLEN values*/
    /*all three sizes take trimmed ending zeroes into account, done either by HuffmanTree_makeFromFrequencies
    or in the loop for numcodes_cl above, which saves space. */
    HLIT = (unsigned)(numcodes_ll - 257);
    HDIST = (unsigned)(numcodes_d - 1);
    HCLEN = (unsigned)(numcodes_cl - 4);
    writeBits(writer, HLIT, 5);
    writeBits(writer, HDIST, 5);
    writeBits(writer, HCLEN, 4);

    /*write the code lengths of the code length alphabet ("bitlen_cl")*/
    for (i = 0; i != numcodes_cl; ++i) writeBits(writer, tree_cl.lengths[CLCL_ORDER[i]], 3);

    /*write the lengths of the lit/len AND the dist alphabet*/
    for (i = 0; i != numcodes_lld_e; ++i) {
      writeBitsReversed(writer, tree_cl.codes[bitlen_lld_e[i]], tree_cl.lengths[bitlen_lld_e[i]]);
      /*extra bits of repeat codes*/
      if (bitlen_lld_e[i] == 16) writeBits(writer, bitlen_lld_e[++i], 2);
      else if (bitlen_lld_e[i] == 17) writeBits(writer, bitlen_lld_e[++i], 3);
      else if (bitlen_lld_e[i] == 18) writeBits(writer, bitlen_lld_e[++i], 7);
    }

    /*write the compressed data symbols*/
    writeLZ77data(writer, &lz77_encoded, &tree_ll, &tree_d);
    /*error: the length of the end code 256 must be larger than 0*/
    if (tree_ll.lengths[256] == 0) ERROR_BREAK(64);

    /*write the end code*/
    writeBitsReversed(writer, tree_ll.codes[256], tree_ll.lengths[256]);

    break; /*end of error-while*/
  }

  /*cleanup*/
  uivector_cleanup(&lz77_encoded);
  HuffmanTree_cleanup(&tree_ll);
  HuffmanTree_cleanup(&tree_d);
  HuffmanTree_cleanup(&tree_cl);
  lodepng_free(frequencies_ll);
  lodepng_free(frequencies_d);
  lodepng_free(frequencies_cl);
  lodepng_free(bitlen_lld);
  lodepng_free(bitlen_lld_e);

  return error;
}